

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O2

int __thiscall vkt::ssbo::SSBOLayoutCase::init(SSBOLayoutCase *this,EVP_PKEY_CTX *ctx)

{
  ShaderInterface *interface;
  BufferLayout *layout;
  vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_> *this_00
  ;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *blockPointers;
  vector<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_> *blockPointers_00;
  BufferVar *pBVar1;
  uint uVar2;
  MatrixLoadFlags MVar3;
  MatrixLoadFlags matrixLoadFlag;
  BufferBlock *pBVar4;
  pointer pBVar5;
  pointer pBVar6;
  pointer pBVar7;
  pointer pBVar8;
  pointer pBVar9;
  pointer pBVar10;
  pointer ppBVar11;
  pointer pBVar12;
  pointer pBVar13;
  int iVar14;
  int iVar15;
  DataType DVar16;
  deUint32 dVar17;
  int iVar18;
  MatrixLoadFlags MVar19;
  ulong uVar20;
  pointer pBVar21;
  ostream *poVar22;
  undefined8 uVar23;
  iterator iVar24;
  long lVar25;
  int *piVar26;
  uint baseOffset;
  int iVar27;
  int iVar28;
  _Rb_tree_color _Var29;
  VarType *pVVar30;
  char *pcVar31;
  _Rb_tree_color _Var32;
  uint uVar33;
  pointer ppSVar34;
  DataType elemBasicType;
  uint uVar35;
  undefined4 in_stack_fffffffffffffc94;
  int local_330;
  allocator<char> local_32b;
  allocator<char> local_32a;
  allocator<char> local_329;
  ulong local_328;
  string prefix;
  string local_2e0;
  string blockPrefix;
  string local_280;
  ulong local_260;
  ulong local_258;
  ulong local_250;
  vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> namedStructs;
  BufferVarLayoutEntry entry;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  layout = &this->m_refLayout;
  interface = &this->m_interface;
  uVar20 = (ulong)((long)(this->m_interface).m_bufferBlocks.
                         super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_interface).m_bufferBlocks.
                        super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  this_00 = &(this->m_refLayout).bufferVars;
  local_260 = uVar20 & 0xffffffff;
  if ((int)uVar20 < 1) {
    local_260 = 0;
  }
  uVar20 = 0;
  while( true ) {
    if (uVar20 == local_260) break;
    pBVar4 = (this->m_interface).m_bufferBlocks.
             super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar20];
    local_258 = uVar20;
    if (((pBVar4->m_instanceName)._M_string_length == 0) ||
       ((pBVar4->m_instanceName)._M_dataplus._M_p == (pointer)0x0)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockPrefix,"",(allocator<char> *)&entry);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&entry,(pBVar4->m_blockName)._M_dataplus._M_p,(allocator<char> *)&prefix)
      ;
      std::operator+(&blockPrefix,&entry.name,".");
      std::__cxx11::string::~string((string *)&entry);
    }
    pBVar5 = (this->m_refLayout).blocks.
             super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar6 = (this->m_refLayout).blocks.
             super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_328 = ((long)(this->m_refLayout).bufferVars.
                       super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_refLayout).bufferVars.
                      super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x48;
    pBVar21 = (pBVar4->m_variables).
              super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
              _M_impl.super__Vector_impl_data._M_start;
    iVar28 = 0;
    while( true ) {
      if (pBVar21 ==
          *(pointer *)
           ((long)&(pBVar4->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl + 8)) break;
      uVar2 = pBVar4->m_flags;
      pVVar30 = &pBVar21->m_type;
      uVar33 = pBVar21->m_flags;
      uVar35 = uVar33;
      if ((uVar33 & 3) == 0) {
        uVar35 = uVar2;
      }
      if ((uVar33 & 0xc) == 0) {
        uVar33 = uVar2;
      }
      uVar35 = uVar33 & 0xc | uVar35 & 3;
      iVar27 = (int)((ulong)((long)pBVar5 - (long)pBVar6) >> 6);
      if ((pBVar21->m_type).m_type == TYPE_ARRAY) {
        iVar18 = (pBVar21->m_type).m_data.array.size;
        if (iVar18 == -1) {
          iVar18 = 0;
        }
        std::operator+(&entry.name,&blockPrefix,(pBVar21->m_name)._M_dataplus._M_p);
        std::operator+(&prefix,&entry.name,"[0]");
        std::__cxx11::string::~string((string *)&entry);
        if ((uVar2 & 1) == 0) {
          iVar14 = anon_unknown_15::computeStd430BaseAlignment(pVVar30,uVar35);
        }
        else {
          iVar14 = anon_unknown_15::computeStd140BaseAlignment(pVVar30,uVar35);
        }
        baseOffset = -iVar14 & (iVar28 + iVar14) - 1U;
        pVVar30 = (pBVar21->m_type).m_data.array.elementType;
        if (pVVar30->m_type == TYPE_BASIC) {
          DVar16 = (pVVar30->m_data).basic.type;
          if (DVar16 - TYPE_DOUBLE_MAT2 < 9 || DVar16 - TYPE_FLOAT_MAT2 < 9) {
            local_250 = (ulong)DVar16;
            if ((uVar33 & 4) == 0) {
              iVar14 = glu::getDataTypeMatrixNumRows(DVar16);
              iVar15 = glu::getDataTypeMatrixNumColumns(DVar16);
            }
            else {
              iVar14 = glu::getDataTypeMatrixNumColumns(DVar16);
              iVar15 = glu::getDataTypeMatrixNumRows(DVar16);
            }
            DVar16 = glu::getDataTypeFloatVec(iVar14);
            uVar35 = 0;
            if (DVar16 - TYPE_FLOAT < 0x26) {
              uVar35 = *(uint *)(&DAT_009a7148 + (ulong)(DVar16 - TYPE_FLOAT) * 4);
            }
            entry.name._M_dataplus._M_p = (pointer)&entry.name.field_2;
            entry.name._M_string_length = 0;
            entry.name.field_2._M_local_buf[0] = '\0';
            entry.type = TYPE_LAST;
            entry.matrixStride = -1;
            entry.topLevelArraySize = -1;
            entry.topLevelArrayStride = -1;
            entry.blockNdx = -1;
            entry.offset = -1;
            entry.arraySize = -1;
            entry.arrayStride = -1;
            entry.isRowMajor = false;
            std::__cxx11::string::_M_assign((string *)&entry);
            entry.matrixStride = uVar35 + 0xf & 0x30;
            if ((uVar2 & 1) == 0) {
              entry.matrixStride = uVar35;
            }
            entry.topLevelArraySize = 1;
            entry.topLevelArrayStride = 0;
            entry.type = (DataType)local_250;
            uVar35 = iVar15 * entry.matrixStride;
            entry.isRowMajor = SUB41((uVar33 & 4) >> 2,0);
            entry.blockNdx = iVar27;
            entry.offset = baseOffset;
            entry.arraySize = iVar18;
            entry.arrayStride = uVar35;
            std::
            vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
            ::push_back(this_00,&entry);
            std::__cxx11::string::~string((string *)&entry);
          }
          else {
            uVar33 = 0;
            if (DVar16 - TYPE_FLOAT < 0x26) {
              uVar33 = *(uint *)(&DAT_009a7148 + (ulong)(DVar16 - TYPE_FLOAT) * 4);
            }
            uVar35 = uVar33 + 0xf & 0x30;
            if ((uVar2 & 1) == 0) {
              uVar35 = uVar33;
            }
            entry.name._M_dataplus._M_p = (pointer)&entry.name.field_2;
            entry.name._M_string_length = 0;
            entry.name.field_2._M_local_buf[0] = '\0';
            entry.type = TYPE_LAST;
            entry.matrixStride = -1;
            entry.topLevelArraySize = -1;
            entry.topLevelArrayStride = -1;
            entry.blockNdx = -1;
            entry.offset = -1;
            entry.arraySize = -1;
            entry.arrayStride = -1;
            entry.isRowMajor = false;
            std::__cxx11::string::_M_assign((string *)&entry);
            entry.topLevelArrayStride = 0;
            entry.matrixStride = 0;
            entry.topLevelArraySize = 1;
            entry.type = DVar16;
            entry.blockNdx = iVar27;
            entry.offset = baseOffset;
            entry.arraySize = iVar18;
            entry.arrayStride = uVar35;
            std::
            vector<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
            ::push_back(this_00,&entry);
            std::__cxx11::string::~string((string *)&entry);
          }
        }
        else {
          pBVar7 = (this->m_refLayout).bufferVars.
                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar8 = (this->m_refLayout).bufferVars.
                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          uVar35 = anon_unknown_15::computeReferenceLayout
                             (layout,iVar27,baseOffset,&prefix,pVVar30,uVar35);
          pBVar9 = (this->m_refLayout).bufferVars.
                   super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pBVar10 = (this->m_refLayout).bufferVars.
                    super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          lVar25 = (long)(int)(((long)pBVar8 - (long)pBVar7) / 0x48);
          piVar26 = &pBVar9[lVar25].topLevelArrayStride;
          for (; lVar25 < (int)(((long)pBVar10 - (long)pBVar9) / 0x48); lVar25 = lVar25 + 1) {
            piVar26[-1] = iVar18;
            *piVar26 = uVar35;
            piVar26 = piVar26 + 0x12;
          }
        }
        iVar27 = (baseOffset - iVar28) + uVar35 * iVar18;
        std::__cxx11::string::~string((string *)&prefix);
      }
      else {
        std::operator+(&entry.name,&blockPrefix,(pBVar21->m_name)._M_dataplus._M_p);
        iVar27 = anon_unknown_15::computeReferenceLayout
                           (layout,iVar27,iVar28,&entry.name,pVVar30,uVar35);
        std::__cxx11::string::~string((string *)&entry);
      }
      iVar28 = iVar27 + iVar28;
      pBVar21 = pBVar21 + 1;
    }
    pBVar7 = (this->m_refLayout).bufferVars.
             super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pBVar8 = (this->m_refLayout).bufferVars.
             super__Vector_base<vkt::ssbo::BufferVarLayoutEntry,_std::allocator<vkt::ssbo::BufferVarLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar27 = pBVar4->m_arraySize;
    if (iVar27 < 2) {
      iVar27 = 1;
    }
    for (local_280._M_dataplus._M_p._0_4_ = TYPE_INVALID;
        (int)(DataType)local_280._M_dataplus._M_p < iVar27;
        local_280._M_dataplus._M_p._0_4_ = (DataType)local_280._M_dataplus._M_p + TYPE_FLOAT) {
      entry.name._M_string_length = 0;
      entry.name.field_2._M_local_buf[0] = '\0';
      entry.type = TYPE_INVALID;
      entry.offset = 0;
      entry.arraySize = 0;
      entry.arrayStride = 0;
      entry.matrixStride = 0;
      entry.topLevelArraySize = 0;
      entry.topLevelArrayStride = 0;
      entry.name._M_dataplus._M_p = (pointer)&entry.name.field_2;
      std::vector<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>::
      emplace_back<vkt::ssbo::BlockLayoutEntry>(&layout->blocks,(BlockLayoutEntry *)&entry);
      BlockLayoutEntry::~BlockLayoutEntry((BlockLayoutEntry *)&entry);
      pBVar5 = (this->m_refLayout).blocks.
               super__Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::assign((char *)(pBVar5 + -1));
      pBVar5[-1].size = iVar28;
      uVar20 = local_328;
      while( true ) {
        entry.name._M_dataplus._M_p._0_4_ = (int)uVar20;
        if ((int)(((long)pBVar7 - (long)pBVar8) / 0x48) <= (int)uVar20) break;
        std::vector<int,_std::allocator<int>_>::push_back
                  (&pBVar5[-1].activeVarIndices,(value_type_conflict4 *)&entry);
        uVar20 = (ulong)((int)entry.name._M_dataplus._M_p + 1);
      }
      if (0 < pBVar4->m_arraySize) {
        de::toString<int>(&local_2e0,(int *)&local_280);
        std::operator+(&prefix,"[",&local_2e0);
        std::operator+(&entry.name,&prefix,"]");
        std::__cxx11::string::append((string *)(pBVar5 + -1));
        std::__cxx11::string::~string((string *)&entry);
        std::__cxx11::string::~string((string *)&prefix);
        std::__cxx11::string::~string((string *)&local_2e0);
      }
    }
    std::__cxx11::string::~string((string *)&blockPrefix);
    uVar20 = local_258 + 1;
  }
  anon_unknown_15::initRefDataStorage(interface,layout,&this->m_initialData);
  anon_unknown_15::initRefDataStorage(interface,layout,&this->m_writeData);
  blockPointers = &(this->m_initialData).pointers;
  dVar17 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  anon_unknown_15::generateValues(layout,blockPointers,dVar17 ^ 0xad2f7214);
  blockPointers_00 = &(this->m_writeData).pointers;
  dVar17 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                       );
  anon_unknown_15::generateValues(layout,blockPointers_00,dVar17 ^ 0x25ca4e7);
  uVar20 = 0;
  while (ppBVar11 = (this->m_interface).m_bufferBlocks.
                    super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        (long)uVar20 <
        (long)(int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11) >> 3)
        ) {
    pBVar4 = ppBVar11[uVar20];
    iVar28 = pBVar4->m_arraySize;
    iVar27 = 1;
    if (1 < iVar28) {
      iVar27 = iVar28;
    }
    blockPrefix._M_dataplus._M_p._0_4_ = 0;
    local_328 = uVar20;
    while( true ) {
      if (iVar27 <= (int)blockPrefix._M_dataplus._M_p) break;
      pcVar31 = (pBVar4->m_blockName)._M_dataplus._M_p;
      if (iVar28 < 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&entry,"",&local_32b);
      }
      else {
        de::toString<int>(&local_b0,(int *)&blockPrefix);
        std::operator+(&local_90,"[",&local_b0);
        std::operator+(&entry.name,&local_90,"]");
      }
      std::operator+(&prefix,pcVar31,&entry.name);
      std::__cxx11::string::~string((string *)&entry);
      if (0 < iVar28) {
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      iVar18 = BufferLayout::getBlockIndex(layout,&prefix);
      pBVar12 = (blockPointers->
                super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pBVar13 = (blockPointers_00->
                super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                )._M_impl.super__Vector_impl_data._M_start;
      for (pVVar30 = &((pBVar4->m_variables).
                       super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type;
          iVar14 = (int)blockPrefix._M_dataplus._M_p,
          pBVar1 = (BufferVar *)((long)&pVVar30[-2].m_data + 8),
          pBVar1 != (pBVar4->m_variables).
                    super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pVVar30 = (VarType *)((long)&pVVar30[2].m_data + 8)) {
        if ((pVVar30[1].m_type & 0x400) == TYPE_BASIC) {
          glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)&entry,pVVar30);
          anon_unknown_15::copyNonWrittenData
                    (layout,pBVar4,iVar14,pBVar12 + iVar18,pBVar13 + iVar18,pBVar1,
                     (SubTypeAccess *)&entry);
          glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&entry);
        }
      }
      std::__cxx11::string::~string((string *)&prefix);
      blockPrefix._M_dataplus._M_p._0_4_ = (int)blockPrefix._M_dataplus._M_p + 1;
    }
    uVar20 = local_328 + 1;
  }
  MVar3 = this->m_matrixLoadFlag;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&entry);
  std::operator<<((ostream *)&entry,"#version 310 es\n");
  std::operator<<((ostream *)&entry,"layout(local_size_x = 1) in;\n");
  std::operator<<((ostream *)&entry,"\n");
  std::operator<<((ostream *)&entry,
                  "layout(std140, binding = 0) buffer AcBlock { highp uint ac_numPassed; };\n\n");
  namedStructs.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  namedStructs.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  namedStructs.super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderInterface::getNamedStructs(interface,&namedStructs);
  for (ppSVar34 = namedStructs.
                  super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      ppSVar34 !=
      namedStructs.
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar34 = ppSVar34 + 1) {
    prefix._M_dataplus._M_p = (pointer)*ppSVar34;
    prefix._M_string_length._0_4_ = 0;
    poVar22 = glu::decl::operator<<((ostream *)&entry,(DeclareStructTypePtr *)&prefix);
    std::operator<<(poVar22,";\n");
  }
  lVar25 = 0;
  while (ppBVar11 = (this->m_interface).m_bufferBlocks.
                    super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        lVar25 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                     super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11) >>
                      3)) {
    pBVar4 = ppBVar11[lVar25];
    std::operator<<((ostream *)&entry,"layout(");
    if ((pBVar4->m_flags & 0xf) != 0) {
      prefix._M_dataplus._M_p =
           (pointer)(CONCAT44(prefix._M_dataplus._M_p._4_4_,pBVar4->m_flags) & 0xffffffff0000000f);
      ssbo::operator<<((ostream *)&entry,(LayoutFlagsFmt *)&prefix);
      std::operator<<((ostream *)&entry,", ");
    }
    poVar22 = std::operator<<((ostream *)&entry,"binding = ");
    lVar25 = lVar25 + 1;
    std::ostream::operator<<(poVar22,(int)lVar25);
    std::operator<<((ostream *)&entry,") ");
    poVar22 = std::operator<<((ostream *)&entry,"buffer ");
    std::operator<<(poVar22,(pBVar4->m_blockName)._M_dataplus._M_p);
    std::operator<<((ostream *)&entry,"\n{\n");
    for (pBVar21 = (pBVar4->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar21 !=
        *(pointer *)
         ((long)&(pBVar4->m_variables).
                 super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                 _M_impl + 8); pBVar21 = pBVar21 + 1) {
      std::operator<<((ostream *)&entry,"\t");
      if ((pBVar21->m_flags & 0xf) != 0) {
        poVar22 = std::operator<<((ostream *)&entry,"layout(");
        prefix._M_dataplus._M_p =
             (pointer)(CONCAT44(prefix._M_dataplus._M_p._4_4_,pBVar21->m_flags) & 0xffffffff0000000f
                      );
        ssbo::operator<<(poVar22,(LayoutFlagsFmt *)&prefix);
        std::operator<<(poVar22,") ");
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&blockPrefix,(pBVar21->m_name)._M_dataplus._M_p,
                 (allocator<char> *)&local_2e0);
      glu::decl::DeclareVariable::DeclareVariable
                ((DeclareVariable *)&prefix,&pBVar21->m_type,&blockPrefix,1);
      glu::decl::operator<<((ostream *)&entry,(DeclareVariable *)&prefix);
      glu::decl::DeclareVariable::~DeclareVariable((DeclareVariable *)&prefix);
      std::__cxx11::string::~string((string *)&blockPrefix);
      std::operator<<((ostream *)&entry,";\n");
    }
    std::operator<<((ostream *)&entry,"}");
    if (((pBVar4->m_instanceName)._M_string_length != 0) &&
       ((pBVar4->m_instanceName)._M_dataplus._M_p != (pointer)0x0)) {
      poVar22 = std::operator<<((ostream *)&entry," ");
      pcVar31 = (char *)(pBVar4->m_instanceName)._M_string_length;
      if (pcVar31 != (char *)0x0) {
        pcVar31 = (pBVar4->m_instanceName)._M_dataplus._M_p;
      }
      std::operator<<(poVar22,pcVar31);
      if (0 < pBVar4->m_arraySize) {
        poVar22 = std::operator<<((ostream *)&entry,"[");
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,pBVar4->m_arraySize);
        std::operator<<(poVar22,"]");
      }
    }
    std::operator<<((ostream *)&entry,";\n");
  }
  std::operator<<((ostream *)&entry,"\n");
  prefix._M_string_length._0_4_ = 0;
  prefix.field_2._M_allocated_capacity = 0;
  blockPrefix.field_2._8_8_ = &blockPrefix._M_string_length;
  blockPrefix._M_string_length._0_4_ = 0;
  blockPrefix.field_2._M_allocated_capacity = 0;
  prefix.field_2._8_8_ = &prefix._M_string_length;
  for (lVar25 = 0;
      ppBVar11 = (this->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      lVar25 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                   super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11) >> 3
                    ); lVar25 = lVar25 + 1) {
    pBVar4 = ppBVar11[lVar25];
    for (pBVar21 = (pBVar4->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar21 !=
        *(pointer *)
         ((long)&(pBVar4->m_variables).
                 super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                 _M_impl + 8); pBVar21 = pBVar21 + 1) {
      anon_unknown_15::collectUniqueBasicTypes
                ((set<glu::DataType,_std::less<glu::DataType>,_std::allocator<glu::DataType>_> *)
                 &prefix,&pBVar21->m_type);
    }
  }
  for (uVar23 = prefix.field_2._8_8_; (size_type *)uVar23 != &prefix._M_string_length;
      uVar23 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar23)) {
    local_2e0._M_dataplus._M_p._0_4_ = ((_Rb_tree_node_base *)(uVar23 + 0x20))->_M_color;
    if ((_Rb_tree_color)local_2e0._M_dataplus._M_p - 5 < 9) {
      local_280._M_dataplus._M_p._0_4_ = 1;
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::_M_insert_unique<glu::DataType>
                ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                  *)&blockPrefix,(DataType *)&local_280);
      iVar28 = glu::getDataTypeMatrixNumRows((_Rb_tree_color)local_2e0._M_dataplus._M_p);
      local_280._M_dataplus._M_p._0_4_ = glu::getDataTypeFloatVec(iVar28);
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::_M_insert_unique<glu::DataType>
                ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                  *)&blockPrefix,(DataType *)&local_280);
    }
    else if ((_Rb_tree_color)local_2e0._M_dataplus._M_p + ~_S_black < 3) {
      local_280._M_dataplus._M_p._0_4_ = TYPE_FLOAT;
      std::
      _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
      ::_M_insert_unique<glu::DataType>
                ((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                  *)&blockPrefix,(DataType *)&local_280);
    }
    std::
    _Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
    ::_M_insert_unique<glu::DataType_const&>
              ((_Rb_tree<glu::DataType,glu::DataType,std::_Identity<glu::DataType>,std::less<glu::DataType>,std::allocator<glu::DataType>>
                *)&blockPrefix,(DataType *)&local_2e0);
  }
  _Var29 = ~_S_red;
  while (_Var32 = _Var29, _Var32 != 0x5d) {
    _Var29 = _Var32 + _S_black;
    local_2e0._M_dataplus._M_p._0_4_ = _Var29;
    iVar24 = std::
             _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
             ::find((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
                     *)&blockPrefix,(key_type *)&local_2e0);
    if (iVar24._M_node != (_Base_ptr)&blockPrefix._M_string_length) {
      if (_Var32 < 0x26) {
        pcVar31 = (&PTR_anon_var_dwarf_b084c3_00bd68d0)[_Var32];
      }
      else {
        pcVar31 = (char *)0x0;
      }
      std::operator<<((ostream *)&entry,pcVar31);
    }
  }
  std::
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  ::~_Rb_tree((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
               *)&blockPrefix);
  std::
  _Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
  ::~_Rb_tree((_Rb_tree<glu::DataType,_glu::DataType,_std::_Identity<glu::DataType>,_std::less<glu::DataType>,_std::allocator<glu::DataType>_>
               *)&prefix);
  std::operator<<((ostream *)&entry,"\nvoid main (void)\n{\n\tbool allOk = true;\n");
  uVar20 = 0;
  while (ppBVar11 = (this->m_interface).m_bufferBlocks.
                    super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
        (long)uVar20 <
        (long)(int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                  super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11) >> 3)
        ) {
    pBVar4 = ppBVar11[uVar20];
    matrixLoadFlag = pBVar4->m_arraySize;
    MVar19 = LOAD_MATRIX_COMPONENTS;
    if (1 < (int)matrixLoadFlag) {
      MVar19 = matrixLoadFlag;
    }
    local_2e0._M_dataplus._M_p._0_4_ = _S_red;
    local_328 = uVar20;
    while( true ) {
      if ((int)MVar19 <= (int)(_Rb_tree_color)local_2e0._M_dataplus._M_p) break;
      pBVar5 = (((_Vector_base<vkt::ssbo::BlockLayoutEntry,_std::allocator<vkt::ssbo::BlockLayoutEntry>_>
                  *)&(pBVar4->m_blockName)._M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      if ((int)matrixLoadFlag < 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&prefix,"",&local_32a);
      }
      else {
        de::toString<int>(&local_70,(int *)&local_2e0);
        std::operator+(&local_50,"[",&local_70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix,
                       &local_50,"]");
      }
      std::operator+(&blockPrefix,(char *)pBVar5,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix);
      std::__cxx11::string::~string((string *)&prefix);
      if (0 < (int)matrixLoadFlag) {
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
      iVar28 = BufferLayout::getBlockIndex(layout,&blockPrefix);
      pBVar12 = (blockPointers->
                super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                )._M_impl.super__Vector_impl_data._M_start;
      for (pVVar30 = (VarType *)
                     (*(long *)&(pBVar4->m_variables).
                                super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                                ._M_impl + 0x20);
          _Var29 = (_Rb_tree_color)local_2e0._M_dataplus._M_p,
          pBVar21 = (pointer)((long)&pVVar30[-2].m_data + 8),
          pBVar21 !=
          *(pointer *)
           ((long)&(pBVar4->m_variables).
                   super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_> +
           8); pVVar30 = (VarType *)((long)&pVVar30[2].m_data + 8)) {
        if ((pVVar30[1].m_type & 0x200) != TYPE_BASIC) {
          glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)&prefix,pVVar30);
          anon_unknown_15::generateCompareSrc
                    ((ostream *)&entry,(char *)layout,(BufferLayout *)pBVar4,
                     (BufferBlock *)(ulong)_Var29,iVar28 * 0x10 + (int)pBVar12,
                     (BlockDataPtr *)pBVar21,(BufferVar *)&prefix,
                     (SubTypeAccess *)CONCAT44(in_stack_fffffffffffffc94,MVar3),matrixLoadFlag);
          glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&prefix);
        }
      }
      std::__cxx11::string::~string((string *)&blockPrefix);
      local_2e0._M_dataplus._M_p._0_4_ = (_Rb_tree_color)local_2e0._M_dataplus._M_p + _S_black;
    }
    uVar20 = local_328 + 1;
  }
  poVar22 = std::operator<<((ostream *)&entry,"\tif (allOk)\n");
  poVar22 = std::operator<<(poVar22,"\t\tac_numPassed++;\n");
  std::operator<<(poVar22,"\n");
  for (lVar25 = 0;
      ppBVar11 = (this->m_interface).m_bufferBlocks.
                 super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                 ._M_impl.super__Vector_impl_data._M_start,
      lVar25 < (int)((ulong)((long)(this->m_interface).m_bufferBlocks.
                                   super__Vector_base<vkt::ssbo::BufferBlock_*,_std::allocator<vkt::ssbo::BufferBlock_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar11) >> 3
                    ); lVar25 = lVar25 + 1) {
    pBVar4 = ppBVar11[lVar25];
    iVar28 = pBVar4->m_arraySize;
    iVar27 = 1;
    if (1 < iVar28) {
      iVar27 = iVar28;
    }
    local_330 = 0;
    while( true ) {
      if (iVar27 <= local_330) break;
      pcVar31 = (pBVar4->m_blockName)._M_dataplus._M_p;
      if (iVar28 < 1) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&prefix,"",&local_329);
      }
      else {
        de::toString<int>(&local_280,&local_330);
        std::operator+(&local_2e0,"[",&local_280);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix,
                       &local_2e0,"]");
      }
      std::operator+(&blockPrefix,pcVar31,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prefix);
      std::__cxx11::string::~string((string *)&prefix);
      if (0 < iVar28) {
        std::__cxx11::string::~string((string *)&local_2e0);
        std::__cxx11::string::~string((string *)&local_280);
      }
      iVar18 = BufferLayout::getBlockIndex(layout,&blockPrefix);
      pBVar12 = (blockPointers_00->
                super__Vector_base<vkt::ssbo::BlockDataPtr,_std::allocator<vkt::ssbo::BlockDataPtr>_>
                )._M_impl.super__Vector_impl_data._M_start;
      for (pVVar30 = &((pBVar4->m_variables).
                       super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_type; iVar14 = local_330,
          pBVar1 = (BufferVar *)((long)&pVVar30[-2].m_data + 8),
          pBVar1 != (pBVar4->m_variables).
                    super__Vector_base<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          pVVar30 = (VarType *)((long)&pVVar30[2].m_data + 8)) {
        if ((pVVar30[1].m_type & 0x400) != TYPE_BASIC) {
          glu::SubTypeAccess::SubTypeAccess((SubTypeAccess *)&prefix,pVVar30);
          anon_unknown_15::generateWriteSrc
                    ((ostream *)&entry,layout,pBVar4,iVar14,pBVar12 + iVar18,pBVar1,
                     (SubTypeAccess *)&prefix);
          glu::SubTypeAccess::~SubTypeAccess((SubTypeAccess *)&prefix);
        }
      }
      std::__cxx11::string::~string((string *)&blockPrefix);
      local_330 = local_330 + 1;
    }
  }
  std::operator<<((ostream *)&entry,"}\n");
  std::__cxx11::stringbuf::str();
  std::_Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>::
  ~_Vector_base(&namedStructs.
                 super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>
               );
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&entry);
  std::__cxx11::string::operator=((string *)&this->m_computeShaderSrc,(string *)&prefix);
  iVar28 = std::__cxx11::string::~string((string *)&prefix);
  return iVar28;
}

Assistant:

void SSBOLayoutCase::init ()
{
	computeReferenceLayout	(m_refLayout, m_interface);
	initRefDataStorage		(m_interface, m_refLayout, m_initialData);
	initRefDataStorage		(m_interface, m_refLayout, m_writeData);
	generateValues			(m_refLayout, m_initialData.pointers, deStringHash(getName()) ^ 0xad2f7214);
	generateValues			(m_refLayout, m_writeData.pointers, deStringHash(getName()) ^ 0x25ca4e7);
	copyNonWrittenData		(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers);

	m_computeShaderSrc = generateComputeShader(m_interface, m_refLayout, m_initialData.pointers, m_writeData.pointers, m_matrixLoadFlag);

}